

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDataflow_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::writeOp<(moira::Core)2,(moira::Mode)4,1,0ull>(Moira *this,int n,u32 val)

{
  u32 addr;
  
  this->writeBuffer = (u16)val;
  if ((uint)n < 8) {
    addr = ~(uint)(n == 7) + *(int *)((long)&(this->reg).field_3 + (ulong)(uint)n * 4 + 0x20);
    *(u32 *)((long)&(this->reg).field_3 + (ulong)(uint)n * 4 + 0x20) = addr;
    write<(moira::Core)2,(moira::AddrSpace)1,1,0ull>(this,addr,val);
    return;
  }
  __assert_fail("n < 8",
                "/workspace/llm4binary/github/license_c_cmakelists/dirkwhoffmann[P]Moira/Moira/MoiraDataflow_cpp.h"
                ,0xb,
                "u32 moira::Moira::computeEA(u32) [C = moira::Core::C68020, M = moira::Mode::PD, S = 1, F = 0ULL]"
               );
}

Assistant:

void
Moira::writeOp(int n, u32 val)
{
    switch (M) {

        case Mode::DN: writeD<S>(n, val); break;
        case Mode::AN: writeA<S>(n, val); break;
        case Mode::IM: fatalError;

        default:

            writeBuffer = (S == Long) ? u16(val >> 16) : u16(val & 0xFFFF);

            // Compute effective address
            u32 ea = computeEA<C, M, S>(n);

            // Emulate -(An) register modification
            updateAnPD<M, S>(n);

            // Write to effective address
            writeM<C, M, S, F>(ea, val);

            // Emulate (An)+ register modification
            updateAnPI<M, S>(n);
    }
}